

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteLock.cpp
# Opt level: O2

void __thiscall ReadWriteLock::unlock(ReadWriteLock *this)

{
  int iVar1;
  uint __line;
  char *__assertion;
  
  std::mutex::lock(&this->mMutex);
  iVar1 = this->mCount;
  if (iVar1 < 1) {
    __assertion = "mCount > 0";
    __line = 0x30;
LAB_0018052c:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/ReadWriteLock.cpp"
                  ,__line,"void ReadWriteLock::unlock()");
  }
  if (iVar1 == 1) {
    this->mCount = 0;
    this->mWrite = false;
    std::condition_variable::notify_all();
  }
  else {
    this->mCount = iVar1 + -1;
    if (this->mWrite == true) {
      __assertion = "!mWrite";
      __line = 0x33;
      goto LAB_0018052c;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void ReadWriteLock::unlock()
{
    std::lock_guard<std::mutex> locker(mMutex);
    assert(mCount > 0);
    if (mCount > 1) {
        --mCount;
        assert(!mWrite);
        return;
    }
    --mCount;
    assert(!mCount);
    mWrite = false;
    mCond.notify_all();
}